

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::_makenone(TranslateToFuzzReader *this)

{
  WeightedOption weightedOption;
  WeightedOption rest;
  WeightedOption rest_1;
  WeightedOption rest_2;
  WeightedOption rest_3;
  WeightedOption rest_4;
  bool bVar1;
  Index IVar2;
  FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *pFVar3;
  long *plVar4;
  long extraout_RDX;
  code *local_320;
  Type local_290;
  code *local_288;
  undefined8 local_280;
  FeatureSet local_274;
  code *local_270;
  undefined8 local_268;
  FeatureSet local_25c;
  code *local_258;
  undefined8 local_250;
  FeatureSet local_244;
  code *local_240;
  undefined8 local_238;
  FeatureSet local_22c;
  code *local_228;
  undefined8 local_220;
  FeatureSet local_214;
  code *local_210;
  undefined8 local_208;
  FeatureSet local_1fc;
  code *local_1f8;
  undefined8 local_1f0;
  FeatureSet local_1e4;
  code *local_1e0;
  undefined8 local_1d8;
  FeatureSet local_1cc;
  code *local_1c8;
  undefined8 local_1c0;
  FeatureSet local_1b4;
  code *local_1b0;
  undefined8 local_1a8;
  FeatureSet local_19c;
  code *local_198;
  undefined8 local_190;
  FeatureSet local_184;
  code *local_180;
  undefined8 local_178;
  FeatureSet local_16c;
  code *local_168;
  undefined8 local_160;
  FeatureSet local_154;
  code *local_150;
  undefined8 uStack_148;
  code *local_140;
  undefined8 uStack_138;
  code *local_130;
  undefined8 uStack_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  undefined8 local_108;
  code *local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  code *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  code *local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  code *local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  FeatureSet local_5c;
  undefined1 auStack_58 [8];
  FeatureOptions<Expression_*(Self::*)(Type)> options;
  Index choice;
  TranslateToFuzzReader *this_local;
  
  IVar2 = upTo(this,100);
  if (IVar2 < this->LOGGING_PERCENT) {
    bVar1 = IString::operator_cast_to_bool(&(this->hashMemoryName).super_IString);
    if ((bVar1) && (this->LOGGING_PERCENT >> 1 <= IVar2)) {
      this_local = (TranslateToFuzzReader *)makeMemoryHashLogging(this);
    }
    else {
      this_local = (TranslateToFuzzReader *)makeImportLogging(this);
    }
  }
  else {
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    options.options._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    auStack_58 = (undefined1  [8])0x0;
    options.options._M_t._M_impl._0_8_ = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
    FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *
                   )auStack_58);
    FeatureSet::FeatureSet(&local_5c,0);
    local_88 = makeLocalSet;
    uStack_80 = 0;
    local_78 = 4;
    local_a0 = makeBlock;
    uStack_98 = 0;
    local_90 = 2;
    local_b8 = makeIf;
    uStack_b0 = 0;
    local_a8 = 2;
    local_d0 = makeLoop;
    uStack_c8 = 0;
    local_c0 = 2;
    local_e8 = makeBreak;
    uStack_e0 = 0;
    local_d8 = 2;
    local_100 = makeStore;
    uStack_f8 = 0;
    local_f0 = 2;
    local_110 = makeCall;
    local_108 = 0;
    local_120 = makeCallIndirect;
    local_118 = 0;
    local_130 = makeDrop;
    uStack_128 = 0;
    local_140 = makeNop;
    uStack_138 = 0;
    local_150 = makeGlobalSet;
    uStack_148 = 0;
    weightedOption.weight = 4;
    weightedOption._0_16_ = ZEXT816(0x1b83b0);
    rest.weight = 2;
    rest._0_16_ = ZEXT816(0x1b6be0);
    rest_1.weight = 2;
    rest_1._0_16_ = ZEXT816(0x1ba0f0);
    rest_2.weight = 2;
    rest_2._0_16_ = ZEXT816(0x1ba2e0);
    rest_3.weight = 2;
    rest_3._0_16_ = ZEXT816(0x1ba5d0);
    rest_4.weight = 2;
    rest_4._0_16_ = ZEXT816(0x1c15d0);
    pFVar3 = Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
             add<wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Random::FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::WeightedOption,wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type),wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                       ((FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                         *)auStack_58,local_5c,weightedOption,rest,rest_1,rest_2,rest_3,rest_4,
                        0x1baaa0,0,0x1bae30,0,0x1c1740);
    FeatureSet::FeatureSet(&local_154,0x10);
    local_168 = makeBulkMemory;
    local_160 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_154,0x1c1940);
    FeatureSet::FeatureSet(&local_16c,1);
    local_180 = makeAtomic;
    local_178 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_16c,0x1bf4b0);
    FeatureSet::FeatureSet(&local_184,0x100);
    local_198 = makeTableSet;
    local_190 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_184,0x1c1a80);
    FeatureSet::FeatureSet(&local_19c,0x40);
    local_1b0 = makeTry;
    local_1a8 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_19c,0x1bb3c0);
    FeatureSet::FeatureSet(&local_1b4,0x40);
    local_1c8 = makeTryTable;
    local_1c0 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_1b4,0x1bb8d0);
    FeatureSet::FeatureSet(&local_1cc,0x40);
    local_1e0 = makeImportThrowing;
    local_1d8 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_1cc,0x1b3410);
    FeatureSet::FeatureSet(&local_1e4,0x500);
    local_1f8 = makeCallRef;
    local_1f0 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_1e4,0x1bc020);
    FeatureSet::FeatureSet(&local_1fc,0x500);
    local_210 = makeStructSet;
    local_208 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_1fc,0x1c1b90);
    FeatureSet::FeatureSet(&local_214,0x500);
    local_228 = makeArraySet;
    local_220 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_214,0x1c1ce0);
    FeatureSet::FeatureSet(&local_22c,0x500);
    local_240 = makeBrOn;
    local_238 = 0;
    pFVar3 = Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
             ::add<>(pFVar3,local_22c,0x1bc3e0);
    FeatureSet::FeatureSet(&local_244,0x500);
    local_258 = makeArrayBulkMemoryOp;
    local_250 = 0;
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
              (pFVar3,local_244,0x1c1f20);
    bVar1 = IString::operator_cast_to_bool(&(this->tableSetImportName).super_IString);
    if (bVar1) {
      FeatureSet::FeatureSet(&local_25c,0x100);
      local_270 = makeImportTableSet;
      local_268 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 auStack_58,local_25c,0x1b3730);
    }
    bVar1 = IString::operator_cast_to_bool(&(this->callExportImportName).super_IString);
    if ((bVar1) ||
       (bVar1 = IString::operator_cast_to_bool(&(this->callRefImportName).super_IString), bVar1)) {
      FeatureSet::FeatureSet(&local_274,0);
      local_288 = makeImportCallCode;
      local_280 = 0;
      Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::add<>
                ((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)> *)
                 auStack_58,local_274,0x1b48c0);
    }
    local_320 = (code *)_wasm__TranslateToFuzzReader___constwasm__TranslateToFuzzReader__pick<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>_wasm__Random__FeatureOptions<wasm::Expression*(wasm::TranslateToFuzzReader::*)(wasm::Type)>___
                                  (this,(FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                                         *)auStack_58);
    plVar4 = (long *)((long)&this->wasm + extraout_RDX);
    if (((ulong)local_320 & 1) != 0) {
      local_320 = *(code **)(local_320 + *plVar4 + -1);
    }
    Type::Type(&local_290,none);
    this_local = (TranslateToFuzzReader *)(*local_320)(plVar4,local_290.id);
    Random::FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>::
    ~FeatureOptions((FeatureOptions<wasm::Expression_*(wasm::TranslateToFuzzReader::*)(wasm::Type)>
                     *)auStack_58);
  }
  return (Expression *)this_local;
}

Assistant:

Expression* TranslateToFuzzReader::_makenone() {
  auto choice = upTo(100);
  if (choice < LOGGING_PERCENT) {
    if (!hashMemoryName || choice < LOGGING_PERCENT / 2) {
      return makeImportLogging();
    } else {
      return makeMemoryHashLogging();
    }
  }
  using Self = TranslateToFuzzReader;
  auto options = FeatureOptions<Expression* (Self::*)(Type)>();
  using WeightedOption = decltype(options)::WeightedOption;
  options
    .add(FeatureSet::MVP,
         WeightedOption{&Self::makeLocalSet, VeryImportant},
         WeightedOption{&Self::makeBlock, Important},
         WeightedOption{&Self::makeIf, Important},
         WeightedOption{&Self::makeLoop, Important},
         WeightedOption{&Self::makeBreak, Important},
         WeightedOption{&Self::makeStore, Important},
         &Self::makeCall,
         &Self::makeCallIndirect,
         &Self::makeDrop,
         &Self::makeNop,
         &Self::makeGlobalSet)
    .add(FeatureSet::BulkMemory, &Self::makeBulkMemory)
    .add(FeatureSet::Atomics, &Self::makeAtomic)
    .add(FeatureSet::ReferenceTypes, &Self::makeTableSet)
    .add(FeatureSet::ExceptionHandling, &Self::makeTry)
    .add(FeatureSet::ExceptionHandling, &Self::makeTryTable)
    .add(FeatureSet::ExceptionHandling, &Self::makeImportThrowing)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeCallRef)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeStructSet)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeArraySet)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC, &Self::makeBrOn)
    .add(FeatureSet::ReferenceTypes | FeatureSet::GC,
         &Self::makeArrayBulkMemoryOp);
  if (tableSetImportName) {
    options.add(FeatureSet::ReferenceTypes, &Self::makeImportTableSet);
  }
  if (callExportImportName || callRefImportName) {
    options.add(FeatureSet::MVP, &Self::makeImportCallCode);
  }
  return (this->*pick(options))(Type::none);
}